

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

Curl_cfilter * get_ssl_filter(Curl_cfilter *cf)

{
  Curl_cfilter *local_18;
  Curl_cfilter *cf_local;
  
  local_18 = cf;
  while( true ) {
    if (local_18 == (Curl_cfilter *)0x0) {
      return (Curl_cfilter *)0x0;
    }
    if (local_18->cft == &Curl_cft_ssl) break;
    if (local_18->cft == &Curl_cft_ssl_proxy) {
      return local_18;
    }
    local_18 = local_18->next;
  }
  return local_18;
}

Assistant:

static struct Curl_cfilter *get_ssl_filter(struct Curl_cfilter *cf)
{
  for(; cf; cf = cf->next) {
    if(cf->cft == &Curl_cft_ssl)
      return cf;
#ifndef CURL_DISABLE_PROXY
    if(cf->cft == &Curl_cft_ssl_proxy)
      return cf;
#endif
  }
  return NULL;
}